

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgtbc(fitsfile *fptr,LONGLONG *totalwidth,int *status)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ushort **ppuVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  tcolumn *ptVar8;
  char message [81];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3)) {
      return *status;
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar3 = fptr->Fptr->tfield;
  ptVar8 = fptr->Fptr->tableptr;
  *totalwidth = 0;
  lVar5 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar7 = 0;
  do {
    if (iVar7 == iVar3) {
      return *status;
    }
    ptVar8->tbcol = lVar5;
    uVar2 = ptVar8->tdatatype;
    if (uVar2 == 1) {
      lVar5 = (ptVar8->trepeat + 7) / 8;
    }
    else if (uVar2 == 0x10) {
      lVar5 = ptVar8->trepeat;
    }
    else if ((int)uVar2 < 1) {
      ppuVar4 = __ctype_b_loc();
      pcVar6 = ptVar8->tform;
      do {
        cVar1 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 8) != 0);
      if (cVar1 == 'Q') {
        lVar5 = ptVar8->trepeat << 4;
      }
      else {
        if (cVar1 != 'P') {
          snprintf(message,0x51,"unknown binary table column type: %s",ptVar8->tform);
          ffpmsg(message);
          *status = 0x105;
          return 0x105;
        }
        lVar5 = ptVar8->trepeat << 3;
      }
    }
    else {
      lVar5 = ((ulong)uVar2 / 10) * ptVar8->trepeat;
    }
    lVar5 = lVar5 + *totalwidth;
    *totalwidth = lVar5;
    iVar7 = iVar7 + 1;
    ptVar8 = ptVar8 + 1;
  } while( true );
}

Assistant:

int ffgtbc(fitsfile *fptr,    /* I - FITS file pointer          */
           LONGLONG *totalwidth,  /* O - total width of a table row */
           int *status)       /* IO - error status              */
{
/*
  calculate the starting byte offset of each column of a binary table.
  Use the values of the datatype code and repeat counts in the
  column structure. Return the total length of a row, in bytes.
*/
    int tfields, ii;
    LONGLONG nbytes;
    tcolumn *colptr;
    char message[FLEN_ERRMSG], *cptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    tfields = (fptr->Fptr)->tfield;
    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */

    *totalwidth = 0;

    for (ii = 0; ii < tfields; ii++, colptr++)
    {
        colptr->tbcol = *totalwidth;  /* byte offset in row to this column */

        if (colptr->tdatatype == TSTRING)
        {
            nbytes =  colptr->trepeat;   /* one byte per char */
        }
        else if (colptr->tdatatype == TBIT)
        {
            nbytes = ( colptr->trepeat + 7) / 8;
        }
        else if (colptr->tdatatype > 0)
        {
            nbytes =  colptr->trepeat * (colptr->tdatatype / 10);
        }
        else  {
	
	  cptr = colptr->tform;
	  while (isdigit(*cptr)) cptr++;
	
	  if (*cptr == 'P')  
	   /* this is a 'P' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 8;
	  else if (*cptr == 'Q') 
	   /* this is a 'Q' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 16;

	  else {
		snprintf(message,FLEN_ERRMSG,
		"unknown binary table column type: %s", colptr->tform);
		ffpmsg(message);
		*status = BAD_TFORM;
		return(*status);
	  }
 	}

       *totalwidth = *totalwidth + nbytes;
    }
    return(*status);
}